

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O3

bool __thiscall duckdb::DBConfig::HasArrowExtension(DBConfig *this,ArrowExtensionMetadata *info)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  pointer pAVar2;
  iterator iVar3;
  bool bVar4;
  unordered_map<duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension,_duckdb::HashArrowTypeExtension,_std::equal_to<duckdb::ArrowExtensionMetadata>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>_>
  type_extensions;
  ArrowExtensionMetadata og_info;
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  _Hashtable<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_e0;
  undefined1 local_a8 [32];
  _Alloc_hider local_88;
  _Hash_node_base local_78 [2];
  _Alloc_hider local_68;
  char local_58 [16];
  _Alloc_hider local_48;
  char local_38 [16];
  
  __mutex = (pthread_mutex_t *)
            unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
            ::operator->(&this->arrow_extensions);
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    pAVar2 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
             ::operator->(&this->arrow_extensions);
    local_a8._0_8_ = &local_e0;
    local_e0._M_buckets = (__buckets_ptr)0x0;
    local_e0._M_bucket_count = (pAVar2->type_extensions)._M_h._M_bucket_count;
    local_e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_e0._M_element_count = (pAVar2->type_extensions)._M_h._M_element_count;
    local_e0._M_rehash_policy._M_max_load_factor =
         (pAVar2->type_extensions)._M_h._M_rehash_policy._M_max_load_factor;
    local_e0._M_rehash_policy._4_4_ =
         *(undefined4 *)&(pAVar2->type_extensions)._M_h._M_rehash_policy.field_0x4;
    local_e0._M_rehash_policy._M_next_resize =
         (pAVar2->type_extensions)._M_h._M_rehash_policy._M_next_resize;
    local_e0._M_single_bucket = (__node_base_ptr)0x0;
    ::std::
    _Hashtable<duckdb::ArrowExtensionMetadata,std::pair<duckdb::ArrowExtensionMetadata_const,duckdb::ArrowTypeExtension>,std::allocator<std::pair<duckdb::ArrowExtensionMetadata_const,duckdb::ArrowTypeExtension>>,std::__detail::_Select1st,std::equal_to<duckdb::ArrowExtensionMetadata>,duckdb::HashArrowTypeExtension,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_assign<std::_Hashtable<duckdb::ArrowExtensionMetadata,std::pair<duckdb::ArrowExtensionMetadata_const,duckdb::ArrowTypeExtension>,std::allocator<std::pair<duckdb::ArrowExtensionMetadata_const,duckdb::ArrowTypeExtension>>,std::__detail::_Select1st,std::equal_to<duckdb::ArrowExtensionMetadata>,duckdb::HashArrowTypeExtension,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<duckdb::ArrowExtensionMetadata_const,duckdb::ArrowTypeExtension>,false>>>>
              ((_Hashtable<duckdb::ArrowExtensionMetadata,std::pair<duckdb::ArrowExtensionMetadata_const,duckdb::ArrowTypeExtension>,std::allocator<std::pair<duckdb::ArrowExtensionMetadata_const,duckdb::ArrowTypeExtension>>,std::__detail::_Select1st,std::equal_to<duckdb::ArrowExtensionMetadata>,duckdb::HashArrowTypeExtension,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_a8._0_8_,&(pAVar2->type_extensions)._M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_false>_>_>
                *)local_a8);
    iVar3 = ::std::
            _Hashtable<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&local_e0,info);
    bVar4 = true;
    if (iVar3.
        super__Node_iterator_base<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_false>
        ._M_cur == (__node_type *)0x0) {
      ArrowExtensionMetadata::ArrowExtensionMetadata((ArrowExtensionMetadata *)local_a8,info);
      local_100[0] = local_f0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,anon_var_dwarf_63f17de + 9);
      ::std::__cxx11::string::operator=((string *)&info->arrow_format,(string *)local_100);
      if (local_100[0] != local_f0) {
        operator_delete(local_100[0]);
      }
      iVar3 = ::std::
              _Hashtable<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&local_e0,info);
      bVar4 = iVar3.
              super__Node_iterator_base<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_false>
              ._M_cur != (__node_type *)0x0;
      if (local_48._M_p != local_38) {
        operator_delete(local_48._M_p);
      }
      if (local_68._M_p != local_58) {
        operator_delete(local_68._M_p);
      }
      if ((_Hash_node_base *)local_88._M_p != local_78) {
        operator_delete(local_88._M_p);
      }
      if ((_Hashtable<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)local_a8._0_8_ !=
          (_Hashtable<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_);
      }
    }
    ::std::
    _Hashtable<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_e0);
    pthread_mutex_unlock(__mutex);
    return bVar4;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

bool DBConfig::HasArrowExtension(ArrowExtensionMetadata info) const {
	lock_guard<mutex> l(arrow_extensions->lock);
	auto type_extensions = arrow_extensions->type_extensions;

	if (type_extensions.find(info) != type_extensions.end()) {
		return true;
	}

	auto og_info = info;
	info.SetArrowFormat("");
	if (type_extensions.find(info) != type_extensions.end()) {
		return true;
	}

	return false;
}